

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O3

int oonf_cfg_load_subsystems(void)

{
  avl_node *paVar1;
  list_entity *plVar2;
  int iVar3;
  oonf_subsystem *poVar4;
  size_t sVar5;
  char *pcVar6;
  avl_node *paVar7;
  char *pcVar8;
  avl_node *paVar9;
  list_entity *plVar10;
  size_t sVar11;
  oonf_subsystem_namebuf nbuf;
  oonf_subsystem_namebuf oStack_48;
  
  if ((config_global.plugin.value != (char *)0x0) &&
     (pcVar8 = config_global.plugin.value, pcVar6 = config_global.plugin.value,
     sVar11 = config_global.plugin.length,
     config_global.plugin.value < config_global.plugin.value + config_global.plugin.length)) {
    do {
      if (*pcVar8 != '\0') {
        oonf_subsystem_extract_name(&oStack_48,pcVar8);
        poVar4 = oonf_cfg_load_subsystem(oStack_48.name);
        pcVar6 = config_global.plugin.value;
        sVar11 = config_global.plugin.length;
        if ((poVar4 == (oonf_subsystem *)0x0) && (config_global.failfast != false)) {
          return -1;
        }
      }
      sVar5 = strlen(pcVar8);
      pcVar8 = pcVar8 + sVar5 + 1;
    } while (pcVar8 < pcVar6 + sVar11);
  }
  plVar10 = oonf_plugin_tree.list_head.next;
  paVar9 = (avl_node *)oonf_plugin_tree.list_head.next;
  if ((oonf_plugin_tree.list_head.next)->prev != oonf_plugin_tree.list_head.prev) {
    do {
      paVar1 = (avl_node *)(paVar9->list).next;
      if (paVar9[-1].key != (void *)0x0) {
        if (config_global.plugin.value != (char *)0x0) {
          pcVar6 = config_global.plugin.value + config_global.plugin.length;
          for (pcVar8 = config_global.plugin.value; pcVar8 < pcVar6; pcVar8 = pcVar8 + sVar5 + 1) {
            oonf_subsystem_extract_name(&oStack_48,pcVar8);
            paVar7 = avl_find(&oonf_plugin_tree,&oStack_48);
            if (paVar7 == paVar9) goto LAB_0012b615;
            sVar5 = strlen(pcVar8);
            pcVar6 = config_global.plugin.value + config_global.plugin.length;
          }
        }
        oonf_subsystem_unload((oonf_subsystem *)(paVar9 + -2));
      }
LAB_0012b615:
      plVar10 = oonf_plugin_tree.list_head.next;
      paVar9 = paVar1;
    } while ((paVar1->list).prev != oonf_plugin_tree.list_head.prev);
  }
  do {
    if (plVar10->prev == oonf_plugin_tree.list_head.prev) {
      return 0;
    }
    plVar2 = plVar10->next;
    iVar3 = oonf_subsystem_call_init((oonf_subsystem *)(plVar10 + -7));
    plVar10 = plVar2;
  } while (iVar3 == 0);
  return -1;
}

Assistant:

int
oonf_cfg_load_subsystems(void) {
  struct oonf_subsystem *plugin, *plugin_it;
  struct oonf_subsystem_namebuf nbuf;
  char *ptr;
  bool found;

  /* load plugins */
  strarray_for_each_element(&config_global.plugin, ptr) {
    /* ignore empty strings */
    if (*ptr == 0) {
      continue;
    }

    oonf_subsystem_extract_name(&nbuf, ptr);

    if (oonf_cfg_load_subsystem(nbuf.name) == NULL && config_global.failfast) {
      return -1;
    }
  }

  /* unload all plugins that are not in use anymore */
  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, plugin_it) {
    if (plugin->_dlhandle == NULL) {
      /* ignore static plugins */
      continue;
    }

    found = false;

    /* search if plugin should still be active */
    strarray_for_each_element(&config_global.plugin, ptr) {
      oonf_subsystem_extract_name(&nbuf, ptr);

      if (oonf_subsystem_get(nbuf.name) == plugin) {
        found = true;
        break;
      }
    }

    if (!found) {
      /* if not, unload it (if not static) */
      oonf_subsystem_unload(plugin);
    }
  }

  /* initialize all plugins */
  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, plugin_it) {
    if (oonf_subsystem_call_init(plugin)) {
      return -1;
    }
  }
  return 0;
}